

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  lua_CFunction *pp_Var1;
  byte bVar2;
  lua_CFunction p_Var3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  TValue *pTVar7;
  StkId pTVar8;
  CallInfo *pCVar9;
  long lVar10;
  StkId pTVar11;
  long lVar12;
  long lVar13;
  
  uVar4 = func->tt_;
  while( true ) {
    pTVar11 = L->stack;
    uVar4 = uVar4 & 0x3f;
    if (uVar4 == 6) {
      lVar12 = *(long *)((func->value_).f + 0x18);
      pTVar8 = L->top;
      if ((long)L->stack_last - (long)pTVar8 >> 4 <= (long)(ulong)*(byte *)(lVar12 + 0x7a)) {
        luaD_growstack(L,(uint)*(byte *)(lVar12 + 0x7a));
      }
      lVar13 = (long)func - (long)pTVar11;
      bVar2 = *(byte *)(lVar12 + 0x78);
      uVar4 = (int)((ulong)((long)pTVar8 - (long)func) >> 4) - 1;
      for (uVar5 = uVar4; (int)uVar5 < (int)(uint)bVar2; uVar5 = uVar5 + 1) {
        pTVar11 = L->top;
        L->top = pTVar11 + 1;
        pTVar11->tt_ = 0;
      }
      if ((int)uVar4 <= (int)(uint)bVar2) {
        uVar4 = (uint)bVar2;
      }
      if (*(char *)(lVar12 + 0x79) == '\0') {
        pTVar8 = L->stack;
        pTVar11 = (StkId)((long)pTVar8 + lVar13 + 0x10);
      }
      else {
        pTVar11 = L->top;
        if ((long)L->stack_last - (long)pTVar11 >> 4 <= (long)(ulong)*(byte *)(lVar12 + 0x7a)) {
          luaD_growstack(L,(uint)*(byte *)(lVar12 + 0x7a));
          pTVar11 = L->top;
        }
        for (lVar10 = 0; (ulong)bVar2 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
          pTVar8 = L->top;
          L->top = pTVar8 + 1;
          pTVar8->value_ = *(Value *)((long)&pTVar11[-(ulong)uVar4].value_ + lVar10);
          pTVar8->tt_ = *(int *)((long)&pTVar11[-(ulong)uVar4].tt_ + lVar10);
          *(undefined4 *)((long)&pTVar11[-(ulong)uVar4].tt_ + lVar10) = 0;
        }
        pTVar8 = L->stack;
      }
      pCVar9 = L->ci->next;
      if (pCVar9 == (CallInfo *)0x0) {
        pCVar9 = luaE_extendCI(L);
      }
      L->ci = pCVar9;
      pCVar9->nresults = (short)nresults;
      pCVar9->func = (StkId)(lVar13 + (long)pTVar8);
      (pCVar9->u).l.base = pTVar11;
      bVar2 = *(byte *)(lVar12 + 0x7a);
      pCVar9->top = pTVar11 + bVar2;
      (pCVar9->u).l.savedpc = *(Instruction **)(lVar12 + 0x18);
      pCVar9->callstatus = '\x01';
      L->top = pTVar11 + bVar2;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      if ((L->hookmask & 1) != 0) {
        pp_Var1 = &(pCVar9->u).c.k;
        *pp_Var1 = *pp_Var1 + 4;
        iVar6 = 0;
        if (((pCVar9->previous->callstatus & 1) != 0) &&
           ((*(uint *)((pCVar9->previous->u).c.k + -4) & 0x3f) == 0x1e)) {
          pCVar9->callstatus = pCVar9->callstatus | 0x40;
          iVar6 = 4;
        }
        luaD_hook(L,iVar6,-1);
        pp_Var1 = &(pCVar9->u).c.k;
        *pp_Var1 = *pp_Var1 + -4;
      }
      return 0;
    }
    pTVar7 = func;
    if (uVar4 == 0x16) break;
    if (uVar4 == 0x26) {
      pTVar7 = (TValue *)((func->value_).f + 0x18);
      break;
    }
    pTVar7 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar7->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar11 = L->stack;
    for (pTVar8 = L->top; func < pTVar8; pTVar8 = pTVar8 + -1) {
      pTVar8->value_ = pTVar8[-1].value_;
      pTVar8->tt_ = pTVar8[-1].tt_;
    }
    pTVar8 = L->top;
    L->top = pTVar8 + 1;
    if ((long)L->stack_last - (long)(pTVar8 + 1) < 0x10) {
      luaD_growstack(L,0);
    }
    lVar12 = (long)func - (long)pTVar11;
    pTVar11 = L->stack;
    *(Value *)((long)pTVar11 + lVar12) = pTVar7->value_;
    uVar4 = pTVar7->tt_;
    *(uint *)((long)pTVar11 + lVar12 + 8) = uVar4;
    func = (StkId)(lVar12 + (long)pTVar11);
  }
  p_Var3 = (pTVar7->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    luaD_growstack(L,0x14);
  }
  pCVar9 = L->ci->next;
  if (pCVar9 == (CallInfo *)0x0) {
    pCVar9 = luaE_extendCI(L);
  }
  L->ci = pCVar9;
  pCVar9->nresults = (short)nresults;
  pCVar9->func = (StkId)(((long)func - (long)pTVar11) + (long)L->stack);
  pCVar9->top = L->top + 0x14;
  pCVar9->callstatus = '\0';
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar6 = (*p_Var3)(L);
  luaD_poscall(L,L->top + -(long)iVar6);
  return 1;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      luaD_checkstack(L, p->maxstacksize);
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      if (!p->is_vararg) {
        func = restorestack(L, funcr);
        base = func + 1;
      }
      else {
        base = adjust_varargs(L, p, n);
        func = restorestack(L, funcr);  /* previous call can change stack */
      }
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      luaC_checkGC(L);  /* stack grow uses memory */
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}